

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_start(jit_State *J)

{
  TValue *pTVar1;
  VMEvent ev;
  GCstr *pGVar2;
  void *in_RDI;
  BCOp op;
  ptrdiff_t argbase;
  TraceNo traceno;
  lua_State *L;
  jit_State *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  jit_State *in_stack_fffffffffffffeb0;
  lua_State *in_stack_fffffffffffffec0;
  lua_State *L_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  
  if ((*(byte *)(*(long *)((long)in_RDI + 0x80) + 0x25) & 8) == 0) {
    ev = trace_findfree(in_stack_fffffffffffffe98);
    if (ev == LJ_VMEVENT_BC_) {
      lj_trace_flushall(in_stack_fffffffffffffec0);
      *(undefined4 *)((long)in_RDI + 0xd4) = 0;
    }
    else {
      *(int *)(*(long *)((long)in_RDI + 0x170) + (ulong)(uint)ev * 4) = (int)in_RDI;
      memset(in_RDI,0,0x60);
      *(short *)((long)in_RDI + 0x50) = (short)ev;
      *(undefined4 *)((long)in_RDI + 0x18) = 0x8000;
      *(undefined4 *)((long)in_RDI + 8) = 0x8000;
      *(undefined8 *)((long)in_RDI + 0x10) = *(undefined8 *)((long)in_RDI + 0x138);
      *(undefined8 *)((long)in_RDI + 0x20) = *(undefined8 *)((long)in_RDI + 0x150);
      *(undefined8 *)((long)in_RDI + 0x28) = *(undefined8 *)((long)in_RDI + 0x158);
      *(undefined1 *)((long)in_RDI + 0x9c) = 0;
      *(undefined1 *)((long)in_RDI + 0x9d) = 0;
      *(undefined1 *)((long)in_RDI + 0x9f) = 0;
      *(undefined1 *)((long)in_RDI + 0x9e) = 0;
      *(undefined4 *)((long)in_RDI + 0x164) = 0;
      *(undefined1 *)((long)in_RDI + 0x168) = 0;
      *(undefined2 *)((long)in_RDI + 0x180) = 0;
      *(int *)((long)in_RDI + 0x30) = (int)*(undefined8 *)((long)in_RDI + 0x80);
      L_00 = *(lua_State **)((long)in_RDI + 0x68);
      if (((*(byte *)((ulong)(L_00->glref).ptr32 + 0x10b) & 2) != 0) &&
         (in_stack_fffffffffffffeb0 = (jit_State *)lj_vmevent_prepare(L_00,ev),
         in_stack_fffffffffffffeb0 != (jit_State *)0x0)) {
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pGVar2 = lj_str_new((lua_State *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff08,
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        (pTVar1->u32).lo = (uint32_t)pGVar2;
        (pTVar1->field_2).it = 0xfffffffb;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pTVar1->n = (double)ev;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        (pTVar1->u32).lo = (uint32_t)*(undefined8 *)((long)in_RDI + 0x78);
        (pTVar1->field_2).it = 0xfffffff7;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pTVar1->n = (double)(int)(*(long *)((long)in_RDI + 0x70) -
                                  (*(long *)((long)in_RDI + 0x80) + 0x40) >> 2);
        if (*(int *)((long)in_RDI + 0x9a8) == 0) {
          in_stack_fffffffffffffeac = **(uint **)((long)in_RDI + 0x70) & 0xff;
          if (((in_stack_fffffffffffffeac == 0x41) || (in_stack_fffffffffffffeac == 0x42)) ||
             (in_stack_fffffffffffffeac == 0x45)) {
            pTVar1 = L_00->top;
            L_00->top = pTVar1 + 1;
            pTVar1->n = (double)*(int *)((long)in_RDI + 0x9ac);
            pTVar1 = L_00->top;
            L_00->top = pTVar1 + 1;
            pTVar1->u64 = 0xbff0000000000000;
          }
        }
        else {
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pTVar1->n = (double)*(int *)((long)in_RDI + 0x9a8);
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pTVar1->n = (double)*(int *)((long)in_RDI + 0x9ac);
        }
        lj_vmevent_call((lua_State *)in_stack_fffffffffffffeb0,
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      }
      lj_record_setup(in_stack_fffffffffffffeb0);
    }
  }
  else {
    if ((*(int *)((long)in_RDI + 0x9a8) == 0) && (*(int *)((long)in_RDI + 0x9ac) == 0)) {
      **(char **)((long)in_RDI + 0x70) = (char)**(undefined4 **)((long)in_RDI + 0x70) + '\x01';
      *(byte *)(*(long *)((long)in_RDI + 0x80) + 0x25) =
           *(byte *)(*(long *)((long)in_RDI + 0x80) + 0x25) | 0x10;
    }
    *(undefined4 *)((long)in_RDI + 0xd4) = 0;
  }
  return;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0 && J->exitno == 0) {
      /* Lazy bytecode patching to disable hotcount events. */
      lj_assertJ(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF,
		 "bad hot bytecode %d", bc_op(*J->pc));
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lj_assertJ((J2G(J)->hookmask & HOOK_GC) == 0,
	       "recorder called from GC hook");
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  J->retryrec = 0;
  J->ktrace = 0;
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    } else {
      BCOp op = bc_op(*J->pc);
      if (op == BC_CALLM || op == BC_CALL || op == BC_ITERC) {
	setintV(L->top++, J->exitno);  /* Parent of stitched trace. */
	setintV(L->top++, -1);
      }
    }
  );
  lj_record_setup(J);
}